

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var __thiscall
Js::JavascriptPromise::ResolveHelper
          (JavascriptPromise *this,Var resolution,bool isRejecting,ScriptContext *scriptContext)

{
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar1;
  JavascriptPromiseReactionList *reactions;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RecyclableObject *instance;
  RecyclableObject *thenFunction;
  JavascriptPromiseResolveThenableTaskFunction *taskVar;
  undefined4 *puVar5;
  Var pvVar6;
  undefined7 in_register_00000011;
  Type local_31;
  
  if ((int)CONCAT71(in_register_00000011,isRejecting) == 0) {
    this_00 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    pRVar1 = (this_00->super_JavascriptLibraryBase).undefinedValue.ptr;
    bVar3 = JavascriptConversion::SameValueCommon<false>(resolution,this);
    if (!bVar3) {
      bVar3 = VarIs<Js::RecyclableObject>(resolution);
      local_31 = PromiseStatusCode_HasResolution;
      if (bVar3) {
        instance = VarTo<Js::RecyclableObject>(resolution);
        pvVar6 = JavascriptOperators::GetPropertyNoCache(instance,0x169,scriptContext);
        bVar3 = JavascriptConversion::IsCallable(pvVar6);
        if (bVar3) {
          thenFunction = VarTo<Js::RecyclableObject>(pvVar6);
          taskVar = JavascriptLibrary::CreatePromiseResolveThenableTaskFunction
                              (this_00,EntryResolveThenableTaskFunction,this,instance,thenFunction);
          JavascriptLibrary::EnqueueTask(this_00,taskVar);
          return pRVar1;
        }
      }
      bVar3 = false;
      goto LAB_00cefbd9;
    }
    resolution = JavascriptLibrary::CreateTypeError
                           ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessage((JavascriptError *)resolution,-0x7ff5ea13,L"",scriptContext);
  }
  local_31 = PromiseStatusCode_HasRejection;
  bVar3 = true;
  if (this->isHandled == false) {
    JavascriptLibrary::CallNativeHostPromiseRejectionTracker
              ((scriptContext->super_ScriptContextBase).javascriptLibrary,this,resolution,false);
  }
LAB_00cefbd9:
  if ((JavascriptError *)resolution == (JavascriptError *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x49d,"(resolution != nullptr)","resolution != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  reactions = (this->reactions).ptr;
  if (reactions != (JavascriptPromiseReactionList *)0x0) {
    SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Reverse
              (&reactions->
                super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>);
  }
  Memory::Recycler::WBSetBit((char *)&this->result);
  (this->result).ptr = resolution;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->result);
  (this->reactions).ptr =
       (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0;
  this->status = local_31;
  pvVar6 = TriggerPromiseReactions(reactions,bVar3,resolution,scriptContext);
  return pvVar6;
}

Assistant:

Var JavascriptPromise::ResolveHelper(Var resolution, bool isRejecting, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var undefinedVar = library->GetUndefined();

        // We only need to check SameValue and check for thenable resolution in the Resolve function case (not Reject)
        if (!isRejecting)
        {
            if (JavascriptConversion::SameValue(resolution, this))
            {
                JavascriptError* selfResolutionError = scriptContext->GetLibrary()->CreateTypeError();
                JavascriptError::SetErrorMessage(selfResolutionError, JSERR_PromiseSelfResolution, _u(""), scriptContext);

                resolution = selfResolutionError;
                isRejecting = true;
            }
            else if (VarIs<RecyclableObject>(resolution))
            {
                try
                {
                    RecyclableObject* thenable = VarTo<RecyclableObject>(resolution);
                    Var then = JavascriptOperators::GetPropertyNoCache(thenable, Js::PropertyIds::then, scriptContext);

                    if (JavascriptConversion::IsCallable(then))
                    {
                        JavascriptPromiseResolveThenableTaskFunction* resolveThenableTaskFunction = library->CreatePromiseResolveThenableTaskFunction(EntryResolveThenableTaskFunction, this, thenable, VarTo<RecyclableObject>(then));

                        library->EnqueueTask(resolveThenableTaskFunction);

                        return undefinedVar;
                    }
                }
                catch (const JavascriptException& err)
                {
                    resolution = err.GetAndClear()->GetThrownObject(scriptContext);

                    if (resolution == nullptr)
                    {
                        resolution = undefinedVar;
                    }

                    isRejecting = true;
                }
            }
        }


        PromiseStatus newStatus;

        // Need to check rejecting state again as it might have changed due to failures
        if (isRejecting)
        {
            newStatus = PromiseStatusCode_HasRejection;
            if (!GetIsHandled())
            {
                scriptContext->GetLibrary()->CallNativeHostPromiseRejectionTracker(this, resolution, false);
            }
        }
        else
        {
            newStatus = PromiseStatusCode_HasResolution;
        }

        Assert(resolution != nullptr);

        // SList only supports "prepend" operation, so we need to reverse the list
        // before triggering reactions
        JavascriptPromiseReactionList* reactions = this->GetReactions();
        if (reactions != nullptr)
        {
            reactions->Reverse();
        }

        this->result = resolution;
        this->reactions = nullptr;
        this->SetStatus(newStatus);

        return TriggerPromiseReactions(reactions, isRejecting, resolution, scriptContext);
    }